

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2cp.c
# Opt level: O1

void i2cp_offer(i2cp_state *state,uint8_t *data,ssize_t sz)

{
  uint8_t *puVar1;
  long lVar2;
  uint8_t uVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  uint32_t uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  
  puVar1 = (state->readcur).buf;
  while( true ) {
    if (sz == 0) {
      i2cp_ringbuf_flush(&state->readbuf,i2cp_read_msg,state);
      return;
    }
    if ((sz < 0) || (uVar9 = (ulong)(state->readcur).sz, 0xffff < uVar9 + sz)) {
      return;
    }
    memcpy((state->readcur).buf + uVar9,data,sz);
    uVar10 = (int)sz + (state->readcur).sz;
    (state->readcur).sz = uVar10;
    if (uVar10 < 5) {
      return;
    }
    uVar6 = *(uint *)puVar1;
    uVar8 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    uVar11 = uVar8 + 5;
    if (uVar10 < uVar11) break;
    uVar4 = (state->readbuf).sz;
    if (uVar4 < 0x20) {
      uVar3 = (state->readcur).buf[4];
      uVar5 = (state->readbuf).idx;
      lVar2 = (ulong)uVar5 * 0x10000 + (ulong)uVar5 * 4;
      (state->readbuf).sz = uVar4 + 1;
      (state->readbuf).idx = uVar5 + 1 & 0x1f;
      *(uint *)((state->readbuf).buffs[0].buf + lVar2 + -4) = uVar11;
      *(uint *)((state->readbuf).buffs[0].buf + lVar2) = uVar6;
      (state->readbuf).buffs[0].buf[lVar2 + 4] = uVar3;
      memcpy((state->readbuf).buffs[0].buf + lVar2 + 5,(state->readcur).buf + 5,(ulong)uVar8);
    }
    uVar7 = (state->readcur).sz;
    (state->readcur).sz = 0;
    uVar11 = uVar7 - uVar11;
    sz = (ssize_t)uVar11;
    if (uVar11 == 0) {
      return;
    }
    data = puVar1 + sz;
  }
  return;
}

Assistant:

void i2cp_offer(struct i2cp_state * state, uint8_t * data, ssize_t sz)
{
  if(sz == 0)
  {
    i2cp_flush_read(state);
    return;
  }
  if(sz < 0) return;
  
  if(sizeof(state->readcur.buf) <= state->readcur.sz + sz)
  {
    return;
  }
  memcpy(state->readcur.buf + state->readcur.sz, data, sz);
  state->readcur.sz += sz;
  

  if(state->readcur.sz > 4)
  {
    uint32_t curlen = bufbe32toh(state->readcur.buf);
    if( curlen + 5 <= state->readcur.sz)
    {
      i2cp_ringbuf_append(&state->readbuf, state->readcur.buf[4], state->readcur.buf + 5, curlen);
      ssize_t diff = state->readcur.sz - (curlen + 5);
      state->readcur.sz = 0;
      if(diff > 0)
        i2cp_offer(state, state->readcur.buf + diff, diff);
    }
  }
}